

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

void __thiscall SHA256::update(SHA256 *this,uchar *message,uint len)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0x40 - this->m_len;
  if (len <= uVar2) {
    uVar2 = len;
  }
  memcpy(this->m_block + this->m_len,message,(ulong)uVar2);
  uVar1 = this->m_len + len;
  if (uVar1 < 0x40) {
    this->m_len = uVar1;
  }
  else {
    uVar1 = len - uVar2;
    transform(this,this->m_block,1);
    transform(this,message + uVar2,uVar1 >> 6);
    memcpy(this->m_block,message + uVar2 + (uVar1 & 0xffffffc0),(ulong)(uVar1 & 0x3f));
    this->m_len = uVar1 & 0x3f;
    this->m_tot_len = this->m_tot_len + (uVar1 & 0xffffffc0) + 0x40;
  }
  return;
}

Assistant:

void SHA256::update(const unsigned char *message, unsigned int len)
{
    unsigned int block_nb;
    unsigned int new_len, rem_len, tmp_len;
    const unsigned char *shifted_message;
    tmp_len = SHA224_256_BLOCK_SIZE - m_len;
    rem_len = len < tmp_len ? len : tmp_len;
    memcpy(&m_block[m_len], message, rem_len);
    if (m_len + len < SHA224_256_BLOCK_SIZE) {
        m_len += len;
        return;
    }
    new_len = len - rem_len;
    block_nb = new_len / SHA224_256_BLOCK_SIZE;
    shifted_message = message + rem_len;
    transform(m_block, 1);
    transform(shifted_message, block_nb);
    rem_len = new_len % SHA224_256_BLOCK_SIZE;
    memcpy(m_block, &shifted_message[block_nb << 6], rem_len);
    m_len = rem_len;
    m_tot_len += (block_nb + 1) << 6;
}